

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

int get_tilemap_x(dbg_layer_t layer)

{
  _Bool _Var1;
  BGCNT_t *pBVar2;
  dbg_layer_t in_EDI;
  BGCNT_t *bgcnt;
  undefined8 in_stack_ffffffffffffffe8;
  int local_4;
  
  pBVar2 = get_bgcnt((dbg_layer_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  _Var1 = is_layer_affine(in_EDI);
  if (!_Var1) {
    switch(pBVar2->raw >> 0xe) {
    case 0:
      local_4 = 0x100;
      break;
    case 1:
      local_4 = 0x200;
      break;
    case 2:
      local_4 = 0x100;
      break;
    case 3:
      local_4 = 0x200;
      break;
    default:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/debug.c"
              ,0xf0);
      fprintf(_stderr,"Invalid screen size: %d\n\x1b[0;m",(ulong)(pBVar2->raw >> 0xe));
      exit(1);
    }
    return local_4;
  }
  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/debug.c",
          0xe4);
  fprintf(_stderr,"aaa\n\x1b[0;m");
  exit(1);
}

Assistant:

int get_tilemap_x(dbg_layer_t layer) {
    BGCNT_t* bgcnt = get_bgcnt(layer);
    if (is_layer_affine(layer)) {
        logfatal("aaa")
    } else {
        switch (bgcnt->screen_size) {
            case 0:
                return 256;
            case 1:
                return 512;
            case 2:
                return 256;
            case 3:
                return 512;
            default:
                logfatal("Invalid screen size: %d", bgcnt->screen_size)
        }
    }
}